

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  uint uVar1;
  long lVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar3;
  undefined1 **ppuVar4;
  appender aVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  char cVar14;
  undefined8 uVar15;
  sign_t sVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  digit_grouping<char> grouping;
  undefined1 local_ff [15];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_f0;
  long local_e8;
  decimal_fp<float> *local_e0;
  int local_d4;
  void *local_d0;
  format_specs<char> *local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  float_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar18 = f->significand;
  uVar12 = 0x1f;
  if ((uVar18 | 1) != 0) {
    for (; (uVar18 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar13 = (ulong)uVar18 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar12 * 8);
  uVar20 = uVar13 >> 0x20;
  iVar6 = (int)(uVar13 >> 0x20);
  local_ff[2] = '0';
  sVar16 = fspecs._5_1_;
  local_ff[1] = sVar16;
  local_ff._7_4_ = iVar6;
  local_ff._11_4_ = uVar18;
  local_78 = fspecs;
  if ((long)uVar13 < 0) goto LAB_001f88bf;
  lVar7 = (uVar20 + 1) - (ulong)(sVar16 == none);
  local_ff[0] = '.';
  uVar12 = fspecs._4_4_;
  bVar3.container = (buffer<char> *)fspecs;
  if ((uVar12 >> 0x11 & 1) != 0) {
    local_f0.container = (buffer<char> *)fspecs;
    local_e8 = lVar7;
    local_d0 = loc.locale_;
    local_c8 = specs;
    local_ff[0] = decimal_point_impl<char>(loc);
    lVar7 = local_e8;
    specs = local_c8;
    loc.locale_ = local_d0;
    bVar3.container = local_f0.container;
  }
  uVar15 = local_b0._M_allocated_capacity;
  uVar1 = f->exponent;
  iVar11 = uVar1 + iVar6;
  iVar17 = (int)bVar3.container;
  if (fspecs._4_1_ == '\x01') {
LAB_001f85cf:
    iVar19 = uVar1 + iVar6 + -1;
    if ((uVar12 >> 0x13 & 1) == 0) {
      uVar13 = 0;
      if (iVar6 == 1) {
        local_ff[0] = '\0';
        uVar13 = 0;
      }
    }
    else {
      uVar13 = 0;
      if (0 < iVar17 - iVar6) {
        uVar13 = (ulong)(uint)(iVar17 - iVar6);
      }
      lVar7 = lVar7 + uVar13;
    }
    local_c0[0] = sVar16;
    local_c0._4_4_ = uVar18;
    local_c0[0xc] = local_ff[0];
    local_c0._8_4_ = iVar6;
    local_b0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar13);
    local_b0._M_allocated_capacity._6_2_ = SUB82(uVar15,6);
    local_b0._M_allocated_capacity =
         CONCAT26(local_b0._M_allocated_capacity._6_2_,
                  CONCAT15(((uVar12 >> 0x10 & 1) == 0) << 5,local_b0._M_allocated_capacity._0_5_)) |
         0x450000000000;
    local_b0._8_4_ = iVar19;
    if (specs->width < 1) {
      bVar3.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_c0,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      if (iVar11 < 1) {
        iVar19 = 1 - iVar11;
      }
      lVar2 = 2;
      if (99 < iVar19) {
        lVar2 = (ulong)(999 < iVar19) + 3;
      }
      sVar9 = lVar7 + (3 - (ulong)(local_ff[0] == '\0')) + lVar2;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out,specs,sVar9,sVar9,(anon_class_28_8_ad0ecca5 *)local_c0);
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar19 = 0x10;
      if (0 < iVar17) {
        iVar19 = iVar17;
      }
      if ((iVar11 < -3) || (iVar19 < iVar11)) goto LAB_001f85cf;
    }
    local_d4 = iVar11;
    if ((int)uVar1 < 0) {
      if (iVar11 < 1) {
        iVar19 = -iVar11;
        iVar6 = iVar19;
        if (SBORROW4(iVar17,iVar19) != iVar17 + iVar11 < 0) {
          iVar6 = iVar17;
        }
        if (iVar17 < 0) {
          iVar6 = iVar19;
        }
        if (uVar20 != 0) {
          iVar6 = iVar19;
        }
        local_70._M_allocated_capacity._0_4_ = iVar6;
        if (iVar6 == 0 && uVar20 == 0) {
          local_ff[3] = (char)((uVar12 & 0x80000) >> 0x13);
          iVar11 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_ff[3] = 1;
          iVar11 = 2;
          if (iVar6 < 0) {
LAB_001f88bf:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                        ,0x189,"negative value");
          }
        }
        sVar9 = lVar7 + (ulong)(uint)(iVar11 + iVar6);
        local_c0._0_8_ = local_ff + 1;
        local_c0._8_8_ = local_ff + 2;
        local_b0._M_allocated_capacity = (size_type)(local_ff + 3);
        local_b0._8_8_ = local_ff;
        local_a0._M_p = (pointer)&local_70;
        local_98 = (float_specs *)(local_ff + 0xb);
        local_90._M_allocated_capacity = (size_type)(local_ff + 7);
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar9,sVar9,(anon_class_56_7_162c6e41 *)local_c0);
        return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      }
      iVar19 = 0;
      local_ff._3_4_ = iVar17 - iVar6 & (int)(uVar12 << 0xc) >> 0x1f;
      uVar18 = local_ff._3_4_;
      if ((int)local_ff._3_4_ < 1) {
        uVar18 = 0;
      }
      local_f0 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      local_e8 = lVar7;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      if (local_98 != (float_specs *)0x0) {
        pcVar8 = (char *)(local_c0._8_8_ + local_c0._0_8_);
        lVar7 = 0;
        pcVar10 = (char *)local_c0._0_8_;
        do {
          if (pcVar10 == pcVar8) {
            cVar14 = pcVar8[-1];
            pcVar10 = pcVar8;
          }
          else {
            cVar14 = *pcVar10;
            if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001f88e6;
            pcVar10 = pcVar10 + 1;
          }
          iVar19 = iVar19 + cVar14;
          if (iVar11 <= iVar19) goto LAB_001f88e6;
          lVar7 = lVar7 + 1;
        } while( true );
      }
      lVar7 = 0;
LAB_001f88e6:
      sVar9 = (ulong)uVar18 + local_e8 + lVar7 + 1;
      local_70._M_allocated_capacity = (size_type)(local_ff + 1);
      local_70._8_8_ = local_ff + 0xb;
      local_60 = local_ff + 7;
      local_58 = &local_d4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_ff;
      local_40._M_allocated_capacity = (size_type)(local_ff + 3);
      local_40._8_8_ = local_ff + 2;
      local_48 = (digit_grouping<char> *)local_c0;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (local_f0.container,specs,sVar9,sVar9,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p);
      }
      ppuVar4 = (undefined1 **)(local_c0 + 0x10);
    }
    else {
      lVar7 = lVar7 + (ulong)uVar1;
      local_ff._3_4_ = iVar17 - iVar11;
      if ((uVar12 >> 0x13 & 1) != 0) {
        lVar7 = lVar7 + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)local_ff._3_4_) {
          if (0 < (int)local_ff._3_4_) {
            lVar7 = lVar7 + (ulong)(uint)local_ff._3_4_;
          }
        }
        else {
          local_ff._3_4_ = 0;
        }
      }
      local_e0 = f;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      iVar6 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        pcVar10 = (char *)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar2 = 0;
        uVar15 = local_70._M_allocated_capacity;
        do {
          if ((char *)uVar15 == pcVar10) {
            cVar14 = pcVar10[-1];
            uVar15 = pcVar10;
          }
          else {
            cVar14 = *(char *)uVar15;
            if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_001f87f5;
            uVar15 = (char *)(uVar15 + 1);
          }
          iVar6 = iVar6 + cVar14;
          if (iVar11 <= iVar6) goto LAB_001f87f5;
          lVar2 = lVar2 + 1;
        } while( true );
      }
      lVar2 = 0;
LAB_001f87f5:
      local_c0._0_8_ = local_ff + 1;
      local_c0._8_8_ = local_ff + 0xb;
      local_b0._M_allocated_capacity = (size_type)(local_ff + 7);
      local_b0._8_8_ = local_e0;
      local_98 = &local_78;
      local_90._M_allocated_capacity = (size_type)local_ff;
      local_90._8_8_ = local_ff + 3;
      local_80 = local_ff + 2;
      local_a0._M_p = (pointer)&local_70;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,lVar7 + lVar2,lVar7 + lVar2,(anon_class_72_9_0c6a3a8a *)local_c0);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      ppuVar4 = &local_60;
    }
    if ((undefined1 **)ppuVar4[-2] != ppuVar4) {
      operator_delete(ppuVar4[-2]);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}